

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateEnterExecutingModeIterativeAsync
               (HelicsFederate fed,HelicsIterationRequest iterate,HelicsError *err)

{
  Federate *this;
  IterationRequest iterate_00;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    iterate_00 = (IterationRequest)(0x700030000020100 >> ((char)iterate * '\b' & 0x3fU));
    if (HELICS_ITERATION_REQUEST_ERROR < iterate) {
      iterate_00 = NO_ITERATIONS;
    }
    helics::Federate::enterExecutingModeAsync(this,iterate_00);
  }
  return;
}

Assistant:

void helicsFederateEnterExecutingModeIterativeAsync(HelicsFederate fed, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->enterExecutingModeAsync(getIterationRequest(iterate));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}